

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_print.c
# Opt level: O1

err_t cmdPrintDate(octet *date)

{
  bool_t bVar1;
  err_t eVar2;
  
  bVar1 = tmDateIsValid2(date);
  if (bVar1 == 0) {
    eVar2 = 0x134;
  }
  else {
    eVar2 = 0;
    printf("%c%c%c%c%c%c",(ulong)(*date + 0x30),(ulong)(date[1] + 0x30),(ulong)(date[2] + 0x30),
           (ulong)(date[3] + 0x30),(ulong)(date[4] + 0x30),date[5] + 0x30);
  }
  return eVar2;
}

Assistant:

err_t cmdPrintDate(const octet date[6])
{
	if (!tmDateIsValid2(date))
		return ERR_BAD_DATE;
	printf("%c%c%c%c%c%c",
		date[0] + '0', date[1] + '0', date[2] + '0',
		date[3] + '0', date[4] + '0', date[5] + '0');
	return ERR_OK;
}